

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_sort.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  ifstream f;
  byte abStack_420 [488];
  fstream of;
  char local_228 [512];
  
  std::ifstream::ifstream(&f,"input",_S_bin);
  std::istream::seekg((long)&f,_S_beg);
  arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = std::istream::tellg();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&arr,lVar1 / 4);
  std::istream::seekg((long)&f,_S_beg);
  while ((abStack_420[*(long *)(_f + -0x18)] & 2) == 0) {
    std::istream::read((char *)&f,(long)&of);
    if ((abStack_420[*(long *)(_f + -0x18)] & 5) == 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&arr,(value_type *)&of);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::fstream::fstream(&of,argv[1],_S_out|_S_bin);
  std::ostream::write(local_228,
                      (long)arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  std::fstream::~fstream(&of);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::ifstream::~ifstream(&f);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    ifstream f("input", std::ios::binary);
    f.seekg(0, ios::end);

    vector<uint32_t > arr;
    arr.reserve(f.tellg()/4);

    f.seekg(0, ios::beg);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            arr.push_back(x);
        }

    }
    sort(arr.begin(), arr.end());

    fstream of(argv[1], std::ios::binary|std::ios::out);
    of.write((char*)arr.data(), arr.size()*4);
    return 0;
}